

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O1

int secp256k1_ge_x_frac_on_curve_var(secp256k1_fe *xn,secp256k1_fe *xd)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  byte bVar7;
  int iVar8;
  ulong uVar9;
  secp256k1_fe *psVar10;
  secp256k1_fe *psVar11;
  int iVar12;
  secp256k1_fe *psVar13;
  secp256k1_fe *psVar14;
  secp256k1_fe *psVar15;
  secp256k1_fe *psVar16;
  ulong uVar17;
  uint64_t *puVar18;
  secp256k1_fe *psVar19;
  uint64_t *puVar20;
  secp256k1_fe *psVar21;
  int iVar22;
  uint uVar23;
  long lVar24;
  long lVar25;
  secp256k1_fe *psVar26;
  secp256k1_fe t;
  secp256k1_fe sStack_258;
  secp256k1_fe *psStack_228;
  secp256k1_fe *psStack_220;
  undefined8 uStack_210;
  undefined1 auStack_208 [48];
  ulong uStack_1d8;
  secp256k1_fe *psStack_1d0;
  undefined1 auStack_1c8 [40];
  secp256k1_modinv64_trans2x2 sStack_1a0;
  secp256k1_fe *psStack_180;
  undefined1 *puStack_178;
  secp256k1_fe sStack_150;
  secp256k1_fe sStack_120;
  secp256k1_modinv64_signed62 sStack_f0;
  secp256k1_fe sStack_c8;
  secp256k1_fe *psStack_98;
  secp256k1_fe *psStack_90;
  secp256k1_fe local_88;
  secp256k1_fe local_58;
  
  psVar26 = &local_88;
  psVar16 = &local_88;
  psVar10 = &local_88;
  psStack_90 = (secp256k1_fe *)0x152f0b;
  secp256k1_fe_verify(xd);
  uVar4 = (xd->n[4] >> 0x30) * 0x1000003d1 + xd->n[0];
  if (((uVar4 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar4 & 0xfffffffffffff) == 0)) {
    uVar9 = (uVar4 >> 0x34) + xd->n[1];
    psVar13 = (secp256k1_fe *)((uVar9 >> 0x34) + xd->n[2]);
    psVar15 = (secp256k1_fe *)(((ulong)psVar13 >> 0x34) + xd->n[3]);
    uVar17 = ((ulong)psVar15 >> 0x34) + (xd->n[4] & 0xffffffffffff);
    psVar19 = (secp256k1_fe *)(undefined1 *)0x1000003d0;
    if ((((uVar9 | uVar4 | (ulong)psVar13 | (ulong)psVar15) & 0xfffffffffffff) == 0 && uVar17 == 0)
       || (((uVar4 | 0x1000003d0) & uVar9 & (ulong)psVar13 & (ulong)psVar15 &
           (uVar17 ^ 0xf000000000000)) == 0xfffffffffffff)) goto LAB_00153103;
  }
  psStack_90 = (secp256k1_fe *)0x152fc4;
  secp256k1_fe_mul(&local_58,xd,xn);
  psStack_90 = (secp256k1_fe *)0x152fd2;
  secp256k1_fe_sqr(&local_88,xn);
  psStack_90 = (secp256k1_fe *)0x152fe0;
  secp256k1_fe_mul(&local_58,&local_58,&local_88);
  psStack_90 = (secp256k1_fe *)0x152feb;
  secp256k1_fe_sqr(&local_88,xd);
  psStack_90 = (secp256k1_fe *)0x152ff6;
  secp256k1_fe_sqr(&local_88,&local_88);
  psStack_90 = (secp256k1_fe *)0x152ffe;
  secp256k1_fe_verify(&local_88);
  if (local_88.magnitude < 5) {
    local_88.magnitude = local_88.magnitude * 7;
    psVar13 = (secp256k1_fe *)(local_88.n[0] * 7);
    local_88.n[1] = local_88.n[1] * 7;
    local_88.n[2] = local_88.n[2] * 7;
    local_88.n[3] = local_88.n[3] * 7;
    local_88.n[4] = local_88.n[4] * 7;
    local_88.normalized = 0;
    psStack_90 = (secp256k1_fe *)0x153087;
    local_88.n[0] = (uint64_t)psVar13;
    secp256k1_fe_verify(&local_88);
    xn = &local_58;
    psStack_90 = (secp256k1_fe *)0x153094;
    secp256k1_fe_verify(xn);
    psStack_90 = (secp256k1_fe *)0x15309c;
    secp256k1_fe_verify(&local_88);
    local_58.magnitude = local_88.magnitude + local_58.magnitude;
    xd = &local_88;
    psVar15 = psVar10;
    if (local_58.magnitude < 0x21) {
      local_58.n[0] = (long)(uint64_t *)local_88.n[0] + local_58.n[0];
      local_58.n[1] = local_58.n[1] + local_88.n[1];
      local_58.n[2] = local_58.n[2] + local_88.n[2];
      local_58.n[3] = local_58.n[3] + local_88.n[3];
      local_58.n[4] = local_58.n[4] + local_88.n[4];
      local_58.normalized = 0;
      psStack_90 = (secp256k1_fe *)0x1530e5;
      secp256k1_fe_verify(&local_58);
      psStack_90 = (secp256k1_fe *)0x1530ed;
      iVar2 = secp256k1_fe_is_square_var(&local_58);
      return iVar2;
    }
  }
  else {
    psStack_90 = (secp256k1_fe *)0x1530fe;
    secp256k1_ge_x_frac_on_curve_var_cold_3();
    psVar13 = psVar26;
    psVar15 = psVar16;
  }
  psStack_90 = (secp256k1_fe *)0x153103;
  secp256k1_ge_x_frac_on_curve_var_cold_2();
  psVar19 = &local_88;
LAB_00153103:
  psStack_90 = (secp256k1_fe *)secp256k1_fe_is_square_var;
  secp256k1_ge_x_frac_on_curve_var_cold_1();
  psStack_90 = xn;
  psStack_98 = xd;
  psVar16 = &sStack_150;
  psVar26 = &sStack_150;
  psVar10 = &sStack_150;
  sStack_120.n[0] = psVar15->n[0];
  sStack_120.n[1] = psVar15->n[1];
  sStack_120.n[2] = psVar15->n[2];
  sStack_120.n[3] = psVar15->n[3];
  sStack_120.n[4] = psVar15->n[4];
  sStack_120.magnitude = psVar15->magnitude;
  sStack_120.normalized = psVar15->normalized;
  secp256k1_fe_verify(psVar15);
  sStack_150.n[0] = psVar15->n[0];
  sStack_150.n[1] = psVar15->n[1];
  sStack_150.n[2] = psVar15->n[2];
  sStack_150.n[3] = psVar15->n[3];
  sStack_150.n[4] = psVar15->n[4];
  sStack_150.magnitude = psVar15->magnitude;
  sStack_150.normalized = psVar15->normalized;
  secp256k1_fe_normalize_var(&sStack_150);
  secp256k1_fe_verify(&sStack_150);
  if (sStack_150.normalized == 0) {
    secp256k1_fe_is_square_var_cold_2();
  }
  else {
    if (((sStack_150.n[2] == 0 && sStack_150.n[3] == 0) &&
        (sStack_150.n[1] == 0 && sStack_150.n[0] == 0)) && sStack_150.n[4] == 0) {
      psVar10 = (secp256k1_fe *)0x1;
    }
    else {
      sStack_f0.v[0] = (sStack_150.n[1] << 0x34 | sStack_150.n[0]) & 0x3fffffffffffffff;
      sStack_f0.v[1] = (ulong)((uint)sStack_150.n[2] & 0xfffff) << 0x2a | sStack_150.n[1] >> 10;
      sStack_f0.v[2] = (ulong)((uint)sStack_150.n[3] & 0x3fffffff) << 0x20 | sStack_150.n[2] >> 0x14
      ;
      sStack_f0.v[3] = (sStack_150.n[4] & 0xffffffffff) << 0x16 | sStack_150.n[3] >> 0x1e;
      sStack_f0.v[4] = sStack_150.n[4] >> 0x28;
      uVar3 = secp256k1_jacobi64_maybe_var(&sStack_f0,&secp256k1_const_modinfo_fe);
      if (uVar3 == 0) {
        uVar3 = secp256k1_fe_sqrt(&sStack_c8,&sStack_150);
        psVar10 = (secp256k1_fe *)(ulong)uVar3;
      }
      else {
        psVar10 = (secp256k1_fe *)(ulong)(~uVar3 >> 0x1f);
      }
    }
    xn = &sStack_120;
    secp256k1_fe_verify(xn);
    sStack_120.n[0] = (sStack_120.n[4] >> 0x30) * 0x1000003d1 + sStack_120.n[0];
    sStack_120.n[1] = (sStack_120.n[0] >> 0x34) + sStack_120.n[1];
    sStack_120.n[2] = (sStack_120.n[1] >> 0x34) + sStack_120.n[2];
    uVar4 = (sStack_120.n[2] >> 0x34) + sStack_120.n[3];
    sStack_120.n[3] = uVar4 & 0xfffffffffffff;
    sStack_120.n[4] = (uVar4 >> 0x34) + (sStack_120.n[4] & 0xffffffffffff);
    sStack_120.n[2] = sStack_120.n[2] & 0xfffffffffffff;
    sStack_120.n[1] = sStack_120.n[1] & 0xfffffffffffff;
    sStack_120.n[0] = sStack_120.n[0] & 0xfffffffffffff;
    sStack_120.magnitude = 1;
    secp256k1_fe_verify(xn);
    psVar13 = xn;
    iVar2 = secp256k1_fe_sqrt(&sStack_150,xn);
    psVar16 = psVar26;
    if ((int)psVar10 == iVar2) {
      return (int)psVar10;
    }
  }
  secp256k1_fe_is_square_var_cold_1();
  puStack_178 = (undefined1 *)psVar19;
  psStack_180 = psVar10;
  auStack_1c8._32_8_ = psVar13->n[4];
  auStack_1c8._16_8_ = psVar13->n[2];
  auStack_1c8._24_8_ = psVar13->n[3];
  auStack_1c8._0_8_ = psVar13->n[0];
  auStack_1c8._8_8_ = psVar13->n[1];
  auStack_208._0_8_ = psVar16->n[0];
  auStack_208._8_8_ = psVar16->n[1];
  auStack_208._16_8_ = psVar16->n[2];
  auStack_208._24_8_ = psVar16->n[3];
  auStack_208._32_8_ = psVar16->n[4];
  if (((((long)auStack_208._0_8_ < 0) || ((long)auStack_208._8_8_ < 0)) ||
      (psVar10 = psVar13, (long)auStack_208._16_8_ < 0)) ||
     ((psVar16 = (secp256k1_fe *)auStack_208._24_8_, (long)auStack_208._24_8_ < 0 ||
      ((long)auStack_208._32_8_ < 0)))) {
LAB_0015377e:
    psStack_220 = (secp256k1_fe *)0x153783;
    secp256k1_jacobi64_maybe_var_cold_18();
LAB_00153783:
    psVar26 = psVar16;
    psStack_220 = (secp256k1_fe *)0x153788;
    secp256k1_jacobi64_maybe_var_cold_11();
LAB_00153788:
    psStack_220 = (secp256k1_fe *)0x15378d;
    secp256k1_jacobi64_maybe_var_cold_10();
LAB_0015378d:
    psVar15 = psVar26;
    psStack_220 = (secp256k1_fe *)0x153792;
    secp256k1_jacobi64_maybe_var_cold_9();
LAB_00153792:
    psStack_220 = (secp256k1_fe *)0x153797;
    secp256k1_jacobi64_maybe_var_cold_8();
    psVar13 = psVar10;
    psVar16 = psVar15;
    psVar26 = xn;
  }
  else {
    psVar26 = xn;
    if (((auStack_208._16_8_ != 0 || (secp256k1_fe *)auStack_208._24_8_ != (secp256k1_fe *)0x0) ||
        (auStack_208._8_8_ != 0 || auStack_208._0_8_ != 0)) || auStack_208._32_8_ != 0) {
      xn = (secp256k1_fe *)0x5;
      lVar25 = -1;
      uStack_1d8 = 0;
      uVar3 = 0;
      auStack_208._40_8_ = psVar13;
      do {
        psVar10 = (secp256k1_fe *)auStack_208._40_8_;
        psVar16 = (secp256k1_fe *)(auStack_1c8._8_8_ << 0x3e | auStack_1c8._0_8_);
        puVar18 = (uint64_t *)(auStack_208._8_8_ << 0x3e | auStack_208._0_8_);
        lVar5 = 0;
        psVar19 = (secp256k1_fe *)0x0;
        lVar24 = 1;
        iVar2 = 0x3e;
        psVar26 = (secp256k1_fe *)0x1;
        puVar20 = puVar18;
        psVar15 = psVar16;
        while( true ) {
          uVar4 = -1L << ((byte)iVar2 & 0x3f) | (ulong)puVar20;
          lVar6 = 0;
          if (uVar4 != 0) {
            for (; (uVar4 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
            }
          }
          bVar7 = (byte)lVar6;
          psVar21 = (secp256k1_fe *)((ulong)puVar20 >> (bVar7 & 0x3f));
          psVar26 = (secp256k1_fe *)((long)psVar26 << (bVar7 & 0x3f));
          lVar5 = lVar5 << (bVar7 & 0x3f);
          lVar25 = lVar25 - lVar6;
          uVar3 = ((uint)((ulong)psVar15 >> 1) ^ (uint)((ulong)psVar15 >> 2)) & (uint)lVar6 ^ uVar3;
          iVar2 = iVar2 - (uint)lVar6;
          psStack_1d0 = xn;
          if (iVar2 == 0) break;
          if (((ulong)psVar15 & 1) == 0) {
            psStack_220 = (secp256k1_fe *)0x15374c;
            secp256k1_jacobi64_maybe_var_cold_7();
LAB_0015374c:
            psStack_220 = (secp256k1_fe *)0x153751;
            secp256k1_jacobi64_maybe_var_cold_6();
LAB_00153751:
            psStack_220 = (secp256k1_fe *)0x153756;
            secp256k1_jacobi64_maybe_var_cold_1();
LAB_00153756:
            psStack_220 = (secp256k1_fe *)0x15375b;
            secp256k1_jacobi64_maybe_var_cold_2();
            goto LAB_0015375b;
          }
          if (((ulong)psVar21 & 1) == 0) goto LAB_0015374c;
          bVar7 = 0x3e - (char)iVar2;
          psVar13 = (secp256k1_fe *)((long)psVar15 << (bVar7 & 0x3f));
          if ((secp256k1_fe *)(lVar5 * (long)puVar18 + (long)psVar26 * (long)psVar16) != psVar13)
          goto LAB_00153751;
          psVar13 = (secp256k1_fe *)(lVar24 * (long)puVar18 + (long)psVar19 * (long)psVar16);
          if (psVar13 != (secp256k1_fe *)((long)psVar21 << (bVar7 & 0x3f))) goto LAB_00153756;
          iVar22 = (int)psVar15;
          iVar12 = (int)psVar21;
          if (lVar25 < 0) {
            lVar25 = -lVar25;
            iVar8 = (int)lVar25 + 1;
            if (iVar2 <= iVar8) {
              iVar8 = iVar2;
            }
            if (0xffffffc1 < iVar8 - 0x3fU) {
              uVar3 = uVar3 ^ (uint)(((ulong)psVar21 & (ulong)psVar15) >> 1);
              psVar13 = (secp256k1_fe *)
                        ((ulong)(0x3fL << (-(char)iVar8 & 0x3fU)) >> (-(char)iVar8 & 0x3fU));
              uVar23 = (iVar12 * iVar12 + 0x3e) * iVar12 * iVar22 & (uint)psVar13;
              lVar6 = lVar5;
              lVar5 = lVar24;
              psVar11 = psVar21;
              psVar14 = psVar26;
              psVar26 = psVar19;
              goto LAB_00153536;
            }
            goto LAB_00153765;
          }
          iVar8 = (int)lVar25 + 1;
          if (iVar2 <= iVar8) {
            iVar8 = iVar2;
          }
          if (iVar8 - 0x3fU < 0xffffffc2) goto LAB_00153760;
          psVar13 = (secp256k1_fe *)
                    ((ulong)(0xfL << (-(char)iVar8 & 0x3fU)) >> (-(char)iVar8 & 0x3fU));
          uVar23 = -(iVar12 * ((iVar22 * 2 + 2U & 8) + iVar22)) & (uint)psVar13;
          lVar6 = lVar24;
          psVar11 = psVar15;
          psVar14 = psVar19;
          psVar15 = psVar21;
LAB_00153536:
          uVar4 = (ulong)uVar23;
          puVar20 = (uint64_t *)((long)psVar15->n + uVar4 * (long)psVar11);
          psVar19 = (secp256k1_fe *)((long)psVar14->n + (long)psVar26 * uVar4);
          lVar24 = uVar4 * lVar5 + lVar6;
          psVar15 = psVar11;
          if (((ulong)puVar20 & (ulong)psVar13) != 0) {
LAB_0015375b:
            psStack_220 = (secp256k1_fe *)0x153760;
            secp256k1_jacobi64_maybe_var_cold_4();
LAB_00153760:
            psStack_220 = (secp256k1_fe *)0x153765;
            secp256k1_jacobi64_maybe_var_cold_3();
LAB_00153765:
            psStack_220 = (secp256k1_fe *)0x15376a;
            secp256k1_jacobi64_maybe_var_cold_5();
            psVar10 = psVar13;
            xn = psVar26;
            goto LAB_0015376a;
          }
        }
        psVar16 = SUB168(SEXT816(lVar5) * SEXT816((long)psVar19),8);
        lVar6 = (long)psVar26 * lVar24 - lVar5 * (long)psVar19;
        uVar4 = (ulong)((ulong)((long)psVar26 * lVar24) < (ulong)(lVar5 * (long)psVar19));
        uVar9 = SUB168(SEXT816((long)psVar26) * SEXT816(lVar24),8) - (long)psVar16;
        psVar15 = (secp256k1_fe *)auStack_208;
        sStack_1a0.u = (int64_t)psVar26;
        sStack_1a0.v = lVar5;
        sStack_1a0.q = (int64_t)psVar19;
        sStack_1a0.r = lVar24;
        if ((uVar9 - uVar4 != -1 || lVar6 != -0x4000000000000000) &&
           (lVar6 != 0x4000000000000000 || uVar9 != uVar4)) goto LAB_0015379c;
        psVar26 = (secp256k1_fe *)auStack_1c8;
        iVar12 = (int)xn;
        psStack_220 = (secp256k1_fe *)0x1535e4;
        psVar16 = psVar26;
        iVar2 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)psVar26,iVar12,
                           (secp256k1_modinv64_signed62 *)auStack_208._40_8_,0);
        if (iVar2 < 1) {
LAB_0015376a:
          psStack_220 = (secp256k1_fe *)0x15376f;
          secp256k1_jacobi64_maybe_var_cold_15();
LAB_0015376f:
          psStack_220 = (secp256k1_fe *)0x153774;
          secp256k1_jacobi64_maybe_var_cold_14();
LAB_00153774:
          psStack_220 = (secp256k1_fe *)0x153779;
          secp256k1_jacobi64_maybe_var_cold_13();
LAB_00153779:
          psStack_220 = (secp256k1_fe *)0x15377e;
          secp256k1_jacobi64_maybe_var_cold_12();
          goto LAB_0015377e;
        }
        psStack_220 = (secp256k1_fe *)0x1535ff;
        psVar16 = psVar26;
        iVar2 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)psVar26,iVar12,
                           (secp256k1_modinv64_signed62 *)psVar10,1);
        if (0 < iVar2) goto LAB_0015376f;
        psStack_220 = (secp256k1_fe *)0x153617;
        psVar16 = psVar15;
        iVar2 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)psVar15,iVar12,
                           (secp256k1_modinv64_signed62 *)psVar10,0);
        if (iVar2 < 1) goto LAB_00153774;
        psStack_220 = (secp256k1_fe *)0x153632;
        psVar16 = psVar15;
        iVar2 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)psVar15,iVar12,
                           (secp256k1_modinv64_signed62 *)psVar10,1);
        if (-1 < iVar2) goto LAB_00153779;
        psStack_220 = (secp256k1_fe *)0x15364d;
        secp256k1_modinv64_update_fg_62_var
                  (iVar12,(secp256k1_modinv64_signed62 *)psVar26,
                   (secp256k1_modinv64_signed62 *)psVar15,&sStack_1a0);
        if (auStack_1c8._0_8_ == 1) {
          if (1 < iVar12) {
            psVar16 = (secp256k1_fe *)0x1;
            uVar4 = 0;
            do {
              uVar4 = uVar4 | *(ulong *)(auStack_1c8 + (long)psVar16 * 8);
              psVar16 = (secp256k1_fe *)((long)psVar16->n + 1);
            } while (xn != psVar16);
            if (uVar4 != 0) goto LAB_0015367f;
          }
          uStack_210._4_4_ = 1 - (uVar3 * 2 & 2);
          bVar1 = false;
        }
        else {
LAB_0015367f:
          lVar5 = (long)iVar12;
          if ((-1 < lVar5 + -2 && (&psStack_1d0)[lVar5] == (secp256k1_fe *)0x0) &&
              (&uStack_210)[lVar5] == 0) {
            xn = (secp256k1_fe *)(ulong)(iVar12 - 1);
          }
          psStack_220 = (secp256k1_fe *)0x1536ac;
          iVar12 = (int)xn;
          psVar16 = psVar26;
          iVar2 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)psVar26,iVar12,
                             (secp256k1_modinv64_signed62 *)psVar10,0);
          if (iVar2 < 1) goto LAB_00153783;
          psStack_220 = (secp256k1_fe *)0x1536c7;
          iVar2 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)psVar26,iVar12,
                             (secp256k1_modinv64_signed62 *)psVar10,1);
          if (0 < iVar2) goto LAB_00153788;
          psStack_220 = (secp256k1_fe *)0x1536df;
          psVar26 = psVar15;
          iVar2 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)psVar15,iVar12,
                             (secp256k1_modinv64_signed62 *)psVar10,0);
          if (iVar2 < 1) goto LAB_0015378d;
          psStack_220 = (secp256k1_fe *)0x1536fa;
          iVar2 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)psVar15,iVar12,
                             (secp256k1_modinv64_signed62 *)psVar10,1);
          bVar1 = true;
          if (-1 < iVar2) goto LAB_00153792;
        }
        if (!bVar1) {
          return uStack_210._4_4_;
        }
        uVar23 = (int)uStack_1d8 + 1;
        uStack_1d8 = (ulong)uVar23;
        psVar13 = psVar10;
        if (uVar23 == 0xc) {
          return 0;
        }
      } while( true );
    }
  }
  psStack_220 = (secp256k1_fe *)0x15379c;
  secp256k1_jacobi64_maybe_var_cold_17();
LAB_0015379c:
  psStack_220 = (secp256k1_fe *)secp256k1_ge_x_on_curve_var;
  secp256k1_jacobi64_maybe_var_cold_16();
  psStack_228 = psVar13;
  psStack_220 = psVar26;
  secp256k1_fe_sqr(&sStack_258,psVar16);
  secp256k1_fe_mul(&sStack_258,&sStack_258,psVar16);
  secp256k1_fe_verify(&sStack_258);
  sStack_258.n[0] = sStack_258.n[0] + 7;
  sStack_258.magnitude = sStack_258.magnitude + 1;
  sStack_258.normalized = 0;
  secp256k1_fe_verify(&sStack_258);
  iVar2 = secp256k1_fe_is_square_var(&sStack_258);
  return iVar2;
}

Assistant:

static int secp256k1_ge_x_frac_on_curve_var(const secp256k1_fe *xn, const secp256k1_fe *xd) {
    /* We want to determine whether (xn/xd) is on the curve.
     *
     * (xn/xd)^3 + 7 is square <=> xd*xn^3 + 7*xd^4 is square (multiplying by xd^4, a square).
     */
     secp256k1_fe r, t;
     VERIFY_CHECK(!secp256k1_fe_normalizes_to_zero_var(xd));

     secp256k1_fe_mul(&r, xd, xn); /* r = xd*xn */
     secp256k1_fe_sqr(&t, xn); /* t = xn^2 */
     secp256k1_fe_mul(&r, &r, &t); /* r = xd*xn^3 */
     secp256k1_fe_sqr(&t, xd); /* t = xd^2 */
     secp256k1_fe_sqr(&t, &t); /* t = xd^4 */
     VERIFY_CHECK(SECP256K1_B <= 31);
     secp256k1_fe_mul_int(&t, SECP256K1_B); /* t = 7*xd^4 */
     secp256k1_fe_add(&r, &t); /* r = xd*xn^3 + 7*xd^4 */
     return secp256k1_fe_is_square_var(&r);
}